

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
revalidate_if_necessary
          (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,map_index_t *bucket_index,KeyNode *node,TreeIterator *it)

{
  uint uVar1;
  NodeBase *pNVar2;
  NodeBase *head;
  bool bVar3;
  ViewType k;
  NodeAndBucket NVar4;
  NodeBase local_20 [2];
  
  uVar1 = (this->super_UntypedMapBase).num_buckets_ - 1 & *bucket_index;
  *bucket_index = uVar1;
  if (((ulong)node & 1) != 0) {
    pNVar2 = local_20;
    KeyMapBase<std::__cxx11::string>::revalidate_if_necessary();
    head = ((NodeBase *)bucket_index)->next;
    if ((NodeBase *)bucket_index != pNVar2) {
      pNVar2 = EraseFromLinkedList(pNVar2,head);
      ((NodeBase *)bucket_index)->next = pNVar2;
      head = (NodeBase *)bucket_index;
    }
    return SUB81(head,0);
  }
  pNVar2 = (NodeBase *)(this->super_UntypedMapBase).table_[uVar1];
  bVar3 = true;
  if (pNVar2 != &node->super_NodeBase) {
    if (((ulong)pNVar2 & 1) == 0 && pNVar2 != (NodeBase *)0x0) {
      do {
        pNVar2 = ((NodeBase *)&pNVar2->next)->next;
        if (pNVar2 == &node->super_NodeBase) break;
      } while (pNVar2 != (NodeBase *)0x0);
      if (pNVar2 != (NodeBase *)0x0) {
        return true;
      }
    }
    k._M_str = (char *)node[1].super_NodeBase.next;
    k._M_len = (size_t)node[2].super_NodeBase.next;
    NVar4 = FindHelper(this,k,it);
    *bucket_index = NVar4.bucket;
    bVar3 = ((this->super_UntypedMapBase).table_[NVar4.bucket] & 1) == 0;
  }
  return bVar3;
}

Assistant:

bool revalidate_if_necessary(map_index_t& bucket_index, KeyNode* node,
                               TreeIterator* it) const {
    // Force bucket_index to be in range.
    bucket_index &= (num_buckets_ - 1);
    // Common case: the bucket we think is relevant points to `node`.
    if (table_[bucket_index] == NodeToTableEntry(node)) return true;
    // Less common: the bucket is a linked list with node_ somewhere in it,
    // but not at the head.
    if (TableEntryIsNonEmptyList(bucket_index)) {
      auto* l = TableEntryToNode(table_[bucket_index]);
      while ((l = l->next) != nullptr) {
        if (l == node) {
          return true;
        }
      }
    }
    // Well, bucket_index_ still might be correct, but probably
    // not.  Revalidate just to be sure.  This case is rare enough that we
    // don't worry about potential optimizations, such as having a custom
    // find-like method that compares Node* instead of the key.
    auto res = FindHelper(node->key(), it);
    bucket_index = res.bucket;
    return TableEntryIsList(bucket_index);
  }